

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

Aig_Obj_t * Rtm_ManToAig_rec(Aig_Man_t *pNew,Rtm_Man_t *pRtm,Rtm_Obj_t *pObjRtm,int *pLatches)

{
  Rtm_Init_t RVar1;
  Rtm_Edg_t *pEdge_00;
  Rtm_Obj_t *pObjRtm_00;
  Aig_Obj_t *pAVar2;
  uint local_74;
  int local_4c;
  int Val;
  int k;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pRes;
  Rtm_Edg_t *pEdge;
  int *pLatches_local;
  Rtm_Obj_t *pObjRtm_local;
  Rtm_Man_t *pRtm_local;
  Aig_Man_t *pNew_local;
  
  if (pObjRtm->pCopy == (void *)0x0) {
    pFanin = Aig_ManConst1(pNew);
    for (local_4c = 0; local_4c < (int)(*(uint *)&pObjRtm->field_0x8 >> 7 & 0xff);
        local_4c = local_4c + 1) {
      pEdge_00 = Rtm_ObjEdge(pObjRtm,local_4c);
      if (((ulong)*pEdge_00 & 0xfff) == 0) {
        pObjRtm_00 = Rtm_ObjFanin(pObjRtm,local_4c);
        _Val = Rtm_ManToAig_rec(pNew,pRtm,pObjRtm_00,pLatches);
      }
      else {
        RVar1 = Rtm_ObjGetFirst(pRtm,pEdge_00);
        pAVar2 = Aig_ManCi(pNew,pLatches[pObjRtm->Id * 2 + local_4c] + (*(uint *)pEdge_00 & 0xfff) +
                                -1);
        _Val = Aig_NotCond(pAVar2,(uint)(RVar1 == RTM_VAL_ONE));
      }
      if (local_4c == 0) {
        local_74 = *(uint *)&pObjRtm->field_0x8 >> 5;
      }
      else {
        local_74 = *(uint *)&pObjRtm->field_0x8 >> 6;
      }
      local_74 = local_74 & 1;
      pAVar2 = Aig_NotCond(_Val,local_74);
      pFanin = Aig_And(pNew,pFanin,pAVar2);
    }
    pObjRtm->pCopy = pFanin;
    pNew_local = (Aig_Man_t *)pFanin;
  }
  else {
    pNew_local = (Aig_Man_t *)pObjRtm->pCopy;
  }
  return (Aig_Obj_t *)pNew_local;
}

Assistant:

Aig_Obj_t * Rtm_ManToAig_rec( Aig_Man_t * pNew, Rtm_Man_t * pRtm, Rtm_Obj_t * pObjRtm, int * pLatches )
{
    Rtm_Edg_t * pEdge;
    Aig_Obj_t * pRes, * pFanin;
    int k, Val;
    if ( pObjRtm->pCopy )
        return (Aig_Obj_t *)pObjRtm->pCopy;
    // get the inputs
    pRes = Aig_ManConst1( pNew );
    Rtm_ObjForEachFaninEdge( pObjRtm, pEdge, k )
    {
        if ( pEdge->nLats == 0 )
            pFanin = Rtm_ManToAig_rec( pNew, pRtm, Rtm_ObjFanin(pObjRtm, k), pLatches );
        else
        {
            Val = Rtm_ObjGetFirst( pRtm, pEdge );
            pFanin = Aig_ManCi( pNew, pLatches[2*pObjRtm->Id + k] + pEdge->nLats - 1 );
            pFanin = Aig_NotCond( pFanin, Val == RTM_VAL_ONE );
        }
        pFanin = Aig_NotCond( pFanin, k ? pObjRtm->fCompl1 : pObjRtm->fCompl0 );
        pRes = Aig_And( pNew, pRes, pFanin );
    }
    return (Aig_Obj_t *)(pObjRtm->pCopy = pRes);
}